

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O0

void __thiscall rcg::anon_unknown_1::IOException::IOException(IOException *this,string *_msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__IOException_00191ae0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

IOException(const std::string &_msg) { msg=_msg; }